

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

void __thiscall
Json::Reader::addComment(Reader *this,Location begin,Location end,CommentPlacement placement)

{
  Value *this_00;
  undefined4 in_register_0000000c;
  String local_70;
  String local_50;
  String *local_30;
  String *normalized;
  Location pCStack_20;
  CommentPlacement placement_local;
  Location end_local;
  Location begin_local;
  Reader *this_local;
  
  normalized._4_4_ = placement;
  pCStack_20 = end;
  end_local = begin;
  begin_local = (Location)this;
  if ((this->collectComments_ & 1U) == 0) {
    __assert_fail("collectComments_",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK/src/external/jsoncpp/src/lib_json/json_reader.cpp"
                  ,0x176,"void Json::Reader::addComment(Location, Location, CommentPlacement)");
  }
  normalizeEOL_abi_cxx11_
            (&local_50,(Reader *)begin,end,(Location)CONCAT44(in_register_0000000c,placement));
  local_30 = &local_50;
  if (normalized._4_4_ == commentAfterOnSameLine) {
    if (this->lastValue_ == (Value *)0x0) {
      __assert_fail("lastValue_ != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK/src/external/jsoncpp/src/lib_json/json_reader.cpp"
                    ,0x179,"void Json::Reader::addComment(Location, Location, CommentPlacement)");
    }
    this_00 = this->lastValue_;
    std::__cxx11::string::string((string *)&local_70,(string *)local_30);
    Value::setComment(this_00,&local_70,normalized._4_4_);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    std::__cxx11::string::operator+=((string *)&this->commentsBefore_,(string *)local_30);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void Reader::addComment(Location begin, Location end,
                        CommentPlacement placement) {
  assert(collectComments_);
  const String& normalized = normalizeEOL(begin, end);
  if (placement == commentAfterOnSameLine) {
    assert(lastValue_ != nullptr);
    lastValue_->setComment(normalized, placement);
  } else {
    commentsBefore_ += normalized;
  }
}